

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall
cmCacheManager::CacheEntry::AppendProperty
          (CacheEntry *this,string *prop,string *value,bool asString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  CacheEntryType CVar4;
  string local_40;
  
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if (iVar3 == 0) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (value->_M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"STRING","");
    }
    else {
      pcVar2 = (value->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar2,pcVar2 + value->_M_string_length);
    }
    CVar4 = cmState::StringToCacheEntryType(&local_40);
    this->Type = CVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)prop);
    if (iVar3 != 0) {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
      return;
    }
    if (value->_M_string_length != 0) {
      if ((this->Value)._M_string_length != 0 && !asString) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::_M_append((char *)this,(ulong)(value->_M_dataplus)._M_p);
      return;
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::AppendProperty(const std::string& prop,
                                                const std::string& value,
                                                bool asString)
{
  if (prop == "TYPE") {
    this->Type =
      cmState::StringToCacheEntryType(!value.empty() ? value : "STRING");
  } else if (prop == "VALUE") {
    if (!value.empty()) {
      if (!this->Value.empty() && !asString) {
        this->Value += ";";
      }
      this->Value += value;
    }
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}